

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
GetEntriesForConflicts_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CTransaction *tx,CTxMemPool *pool,setEntries *iters_conflicting,
          setEntries *all_conflicts)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pointer pcVar5;
  uint *in_R9;
  iterator __begin1;
  iterator __end1;
  _Rb_tree_header *p_Var6;
  long in_FS_OFFSET;
  uint256 txid;
  undefined1 local_a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = *(undefined8 *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uStack_50 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_48 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_40 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  p_Var4 = (iters_conflicting->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(iters_conflicting->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    pcVar5 = (pointer)0x0;
    p_Var3 = p_Var4;
    do {
      pcVar5 = pcVar5 + *(long *)(*(long *)(p_Var3 + 1) + 200);
      if ((pointer)0x64 < pcVar5) {
        local_a0._0_8_ = pcVar5;
        base_blob<256u>::ToString_abi_cxx11_((string *)(local_a0 + 8),&local_58);
        tinyformat::format<std::__cxx11::string,unsigned_long,unsigned_int>
                  (&local_78,
                   (tinyformat *)
                   "rejecting replacement %s; too many potential replacements (%d > %d)\n",
                   (char *)(local_a0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   (unsigned_long *)&MAX_REPLACEMENT_CANDIDATES,in_R9);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload = puVar1;
        paVar2 = &local_78.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == paVar2) {
          *puVar1 = CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x18) = local_78.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_78._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10) =
               CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                        local_78.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = local_78._M_string_length;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = true;
        local_78._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._8_8_ != &local_88) {
          operator_delete((void *)local_a0._8_8_,local_88._0_8_ + 1);
        }
        goto LAB_00287ed7;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var6);
    for (; (_Rb_tree_header *)p_Var4 != p_Var6;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
      CTxMemPool::CalculateDescendants
                (pool,*(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                        **)(p_Var4 + 1),all_conflicts);
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
LAB_00287ed7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> GetEntriesForConflicts(const CTransaction& tx,
                                                  CTxMemPool& pool,
                                                  const CTxMemPool::setEntries& iters_conflicting,
                                                  CTxMemPool::setEntries& all_conflicts)
{
    AssertLockHeld(pool.cs);
    const uint256 txid = tx.GetHash();
    uint64_t nConflictingCount = 0;
    for (const auto& mi : iters_conflicting) {
        nConflictingCount += mi->GetCountWithDescendants();
        // Rule #5: don't consider replacing more than MAX_REPLACEMENT_CANDIDATES
        // entries from the mempool. This potentially overestimates the number of actual
        // descendants (i.e. if multiple conflicts share a descendant, it will be counted multiple
        // times), but we just want to be conservative to avoid doing too much work.
        if (nConflictingCount > MAX_REPLACEMENT_CANDIDATES) {
            return strprintf("rejecting replacement %s; too many potential replacements (%d > %d)\n",
                             txid.ToString(),
                             nConflictingCount,
                             MAX_REPLACEMENT_CANDIDATES);
        }
    }
    // Calculate the set of all transactions that would have to be evicted.
    for (CTxMemPool::txiter it : iters_conflicting) {
        pool.CalculateDescendants(it, all_conflicts);
    }
    return std::nullopt;
}